

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O3

void dumpCallGraph(CallGraph *CG)

{
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> _Var1;
  void *pvVar2;
  long lVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 *local_78;
  CallGraph *local_70;
  undefined8 *local_68;
  void *local_60;
  void *local_58;
  long local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"digraph CallGraph {\n",0x14);
  local_70 = CG;
  (*((CG->_impl)._M_t.
     super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
     ._M_t.
     super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
     .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl)->_vptr_CallGraphImpl
    [2])(&local_48);
  local_78 = local_40;
  if (local_48 != local_40) {
    puVar6 = local_48;
    do {
      _Var1._M_head_impl =
           (local_70->_impl)._M_t.
           super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
           .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl;
      local_68 = puVar6;
      (*(_Var1._M_head_impl)->_vptr_CallGraphImpl[4])(&local_60,_Var1._M_head_impl,*puVar6);
      pvVar2 = local_58;
      for (pvVar5 = local_60; pvVar5 != pvVar2; pvVar5 = (void *)((long)pvVar5 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  \"",3);
        auVar7 = llvm::Value::getName();
        lVar3 = auVar7._0_8_;
        local_b8 = &local_a8;
        if (lVar3 == 0) {
          local_b0 = 0;
          local_a8 = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,lVar3,auVar7._8_8_ + lVar3);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_b8,local_b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" -> \"",6);
        auVar7 = llvm::Value::getName();
        lVar3 = auVar7._0_8_;
        local_98 = &local_88;
        if (lVar3 == 0) {
          local_90 = 0;
          local_88 = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,lVar3,auVar7._8_8_ + lVar3);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
        if (local_98 != &local_88) {
          operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
        }
      }
      if (local_60 != (void *)0x0) {
        operator_delete(local_60,local_50 - (long)local_60);
      }
      puVar6 = local_68 + 1;
    } while (puVar6 != local_78);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  return;
}

Assistant:

static void dumpCallGraph(llvmdg::CallGraph &CG) {
    std::cout << "digraph CallGraph {\n";

    for (const auto *f : CG.functions()) {
        for (const auto *c : CG.callees(f)) {
            std::cout << "  \"" << f->getName().str() << "\" -> \""
                      << c->getName().str() << "\"\n";
        }
    }

    std::cout << "}\n";
}